

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalExpressionSyntax,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ConditionalPredicateSyntax *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3,
          Token *args_4,ExpressionSyntax *args_5)

{
  size_t sVar1;
  pointer ppAVar2;
  Info *pIVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ConditionalExpressionSyntax *pCVar15;
  long lVar16;
  
  pCVar15 = (ConditionalExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalExpressionSyntax *)this->endPtr < pCVar15 + 1) {
    pCVar15 = (ConditionalExpressionSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pCVar15 + 1);
  }
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar11 = args_4->kind;
  uVar12 = args_4->field_0x2;
  NVar13.raw = (args_4->numFlags).raw;
  uVar14 = args_4->rawLen;
  pIVar4 = args_4->info;
  (pCVar15->super_ExpressionSyntax).super_SyntaxNode.kind = ConditionalExpression;
  (pCVar15->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar15->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar15->predicate).ptr = args;
  (pCVar15->question).kind = TVar6;
  (pCVar15->question).field_0x2 = uVar7;
  (pCVar15->question).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar15->question).rawLen = uVar9;
  (pCVar15->question).info = pIVar3;
  uVar10 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar15->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar15->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar10;
  (pCVar15->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pCVar15->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_2->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar15->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pCVar15->attributes).super_SyntaxListBase.childCount = (args_2->super_SyntaxListBase).childCount;
  sVar1 = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pCVar15->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pCVar15->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar1;
  (pCVar15->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc3a8;
  (pCVar15->left).ptr = args_3;
  (pCVar15->colon).kind = TVar11;
  (pCVar15->colon).field_0x2 = uVar12;
  (pCVar15->colon).numFlags = (NumericTokenFlags)NVar13.raw;
  (pCVar15->colon).rawLen = uVar14;
  (pCVar15->colon).info = pIVar4;
  (pCVar15->right).ptr = args_5;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pCVar15;
  (pCVar15->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar15;
  sVar1 = (pCVar15->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (pCVar15->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(ConditionalExpressionSyntax **)(*(long *)((long)ppAVar2 + lVar16) + 8) = pCVar15;
      lVar16 = lVar16 + 8;
    } while (sVar1 << 3 != lVar16);
  }
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pCVar15;
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)pCVar15;
  return pCVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }